

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O2

FString __thiscall swrenderer::Stat_wallcycles::GetStats(Stat_wallcycles *this)

{
  (this->super_FStat)._vptr_FStat = (_func_int **)0x71deec;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if ((WallCycles.Sec != 0.0) && (WallCycles.Sec < bestwallcycles)) {
    bestwallcycles = WallCycles.Sec;
  }
  FString::Format((FString *)this,"%g",bestwallcycles);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT (wallcycles)
{
	FString out;
	double cycles = WallCycles.Time();
	if (cycles && cycles < bestwallcycles)
		bestwallcycles = cycles;
	out.Format ("%g", bestwallcycles);
	return out;
}